

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XSValueTest.cpp
# Opt level: O0

void test_dt_token(void)

{
  byte bVar1;
  int iVar2;
  Status SVar3;
  XMLCh *pXVar4;
  char *pcVar5;
  XSValue *pXVar6;
  char *pcVar7;
  char *pcVar8;
  long lVar9;
  void *pvVar10;
  bool bVar11;
  StrX local_4b8;
  StrX local_4a8;
  StrX local_498;
  long local_488;
  XMLCh *actRetCanRep_5;
  undefined1 local_478 [4];
  Status myStatus_17;
  StrX local_468;
  StrX local_458;
  long local_448;
  XMLCh *actRetCanRep_4;
  undefined1 local_438 [4];
  Status myStatus_16;
  StrX local_428;
  StrX local_418;
  long local_408;
  XMLCh *actRetCanRep_3;
  undefined1 local_3f8 [4];
  Status myStatus_15;
  StrX local_3e8;
  StrX local_3d8;
  long local_3c8;
  XMLCh *actRetCanRep_2;
  undefined1 local_3b8 [4];
  Status myStatus_14;
  StrX local_3a8;
  StrX local_398;
  long local_388;
  XMLCh *actRetCanRep_1;
  undefined1 local_378 [4];
  Status myStatus_13;
  StrX local_368;
  StrX local_358;
  long local_348;
  XMLCh *actRetCanRep;
  Status myStatus_12;
  int j;
  StrX local_328;
  StrX local_318;
  XSValue *local_308;
  XSValue *actRetValue_5;
  undefined1 local_2f8 [4];
  Status myStatus_11;
  StrX local_2e8;
  StrX local_2d8;
  XSValue *local_2c8;
  XSValue *actRetValue_4;
  undefined1 local_2b8 [4];
  Status myStatus_10;
  StrX local_2a8;
  StrX local_298;
  XSValue *local_288;
  XSValue *actRetValue_3;
  undefined1 local_278 [4];
  Status myStatus_9;
  StrX local_268;
  StrX local_258;
  XSValue *local_248;
  XSValue *actRetValue_2;
  undefined1 local_238 [4];
  Status myStatus_8;
  StrX local_228;
  StrX local_218;
  XSValue *local_208;
  XSValue *actRetValue_1;
  undefined1 local_1f8 [4];
  Status myStatus_7;
  StrX local_1e8;
  StrX local_1d8;
  XSValue *local_1c8;
  XSValue *actRetValue;
  Status myStatus_6;
  int i;
  StrX local_1a8;
  byte local_195;
  Status local_194;
  undefined1 local_190 [3];
  bool actRetValid_5;
  Status myStatus_5;
  StrX local_180;
  byte local_16d;
  Status local_16c;
  undefined1 local_168 [3];
  bool actRetValid_4;
  Status myStatus_4;
  StrX local_158;
  byte local_145;
  Status local_144;
  undefined1 local_140 [3];
  bool actRetValid_3;
  Status myStatus_3;
  StrX local_130;
  byte local_11d;
  Status local_11c;
  undefined1 local_118 [3];
  bool actRetValid_2;
  Status myStatus_2;
  StrX local_108;
  byte local_f5;
  Status local_f4;
  undefined1 local_f0 [3];
  bool actRetValid_1;
  Status myStatus_1;
  StrX local_d0;
  byte local_bd;
  Status local_bc;
  char acStack_b8 [3];
  bool actRetValid;
  Status myStatus;
  char iv_3 [5];
  char iv_2 [4];
  char iv_1 [4];
  XSValue_Data act_v_ran_v_3;
  XSValue_Data act_v_ran_v_2;
  XSValue_Data act_v_ran_v_1;
  char v_3 [14];
  char v_2 [8];
  char v_1 [6];
  bool toValidate;
  DataType dt;
  
  builtin_strncpy(v_2 + 4,"4+4=",4);
  stack0xffffffffffffffe0 = 0x327265626d754e;
  v_3[0] = 's';
  v_3[1] = '=';
  v_3[2] = '*';
  v_3[3] = '_';
  v_3[4] = '-';
  v_3[5] = '\0';
  act_v_ran_v_1.fValue._24_6_ = 0x6843656d6f73;
  act_v_ran_v_1.fValue._30_2_ = 0x7261;
  act_v_ran_v_1.f_datatype = dt_string;
  act_v_ran_v_1._4_4_ = 0;
  stack0xffffffffffffff54 = 0x620961;
  iv_3[0] = 'a';
  iv_3[1] = '\n';
  iv_3[2] = 'b';
  iv_3[3] = '\0';
  myStatus._0_1_ = st_Init;
  _acStack_b8 = 0x62202061;
  local_bc = st_Init;
  StrX::StrX(&local_d0,v_2 + 4);
  pXVar4 = StrX::unicodeForm(&local_d0);
  bVar1 = xercesc_4_0::XSValue::validate
                    (pXVar4,dt_token,&local_bc,ver_10,xercesc_4_0::XMLPlatformUtils::fgMemoryManager
                    );
  StrX::~StrX(&local_d0);
  local_bd = bVar1 & 1;
  if (local_bd != 1) {
    pXVar4 = getDataTypeString(dt_token);
    StrX::StrX((StrX *)local_f0,pXVar4);
    pcVar5 = StrX::localForm((StrX *)local_f0);
    printf("VALIDATE_TEST Validation Fail:                                                       at line <%d>, data=<%s>, datatype=<%s>, expRetVal=<%d>\n"
           ,0x153f,v_2 + 4,pcVar5,1);
    StrX::~StrX((StrX *)local_f0);
    errSeen = true;
  }
  local_f4 = st_Init;
  StrX::StrX(&local_108,v_3 + 8);
  pXVar4 = StrX::unicodeForm(&local_108);
  bVar1 = xercesc_4_0::XSValue::validate
                    (pXVar4,dt_token,&local_f4,ver_10,xercesc_4_0::XMLPlatformUtils::fgMemoryManager
                    );
  StrX::~StrX(&local_108);
  local_f5 = bVar1 & 1;
  if (local_f5 != 1) {
    pXVar4 = getDataTypeString(dt_token);
    StrX::StrX((StrX *)local_118,pXVar4);
    pcVar5 = StrX::localForm((StrX *)local_118);
    printf("VALIDATE_TEST Validation Fail:                                                       at line <%d>, data=<%s>, datatype=<%s>, expRetVal=<%d>\n"
           ,0x1540,v_3 + 8,pcVar5,1);
    StrX::~StrX((StrX *)local_118);
    errSeen = true;
  }
  local_11c = st_Init;
  StrX::StrX(&local_130,(char *)((long)&act_v_ran_v_1.fValue + 0x18));
  pXVar4 = StrX::unicodeForm(&local_130);
  bVar1 = xercesc_4_0::XSValue::validate
                    (pXVar4,dt_token,&local_11c,ver_10,
                     xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  StrX::~StrX(&local_130);
  local_11d = bVar1 & 1;
  if (local_11d != 1) {
    pXVar4 = getDataTypeString(dt_token);
    StrX::StrX((StrX *)local_140,pXVar4);
    pcVar5 = StrX::localForm((StrX *)local_140);
    printf("VALIDATE_TEST Validation Fail:                                                       at line <%d>, data=<%s>, datatype=<%s>, expRetVal=<%d>\n"
           ,0x1541,(undefined1 *)((long)&act_v_ran_v_1.fValue + 0x18),pcVar5,1);
    StrX::~StrX((StrX *)local_140);
    errSeen = true;
  }
  local_144 = st_Init;
  StrX::StrX(&local_158,iv_3 + 4);
  pXVar4 = StrX::unicodeForm(&local_158);
  bVar1 = xercesc_4_0::XSValue::validate
                    (pXVar4,dt_token,&local_144,ver_10,
                     xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  StrX::~StrX(&local_158);
  local_145 = bVar1 & 1;
  if (local_145 != 0) {
    pXVar4 = getDataTypeString(dt_token);
    StrX::StrX((StrX *)local_168,pXVar4);
    pcVar5 = StrX::localForm((StrX *)local_168);
    printf("VALIDATE_TEST Validation Fail:                                                       at line <%d>, data=<%s>, datatype=<%s>, expRetVal=<%d>\n"
           ,0x1544,iv_3 + 4,pcVar5,0);
    StrX::~StrX((StrX *)local_168);
    errSeen = true;
  }
  local_16c = st_Init;
  StrX::StrX(&local_180,iv_3);
  pXVar4 = StrX::unicodeForm(&local_180);
  bVar1 = xercesc_4_0::XSValue::validate
                    (pXVar4,dt_token,&local_16c,ver_10,
                     xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  StrX::~StrX(&local_180);
  local_16d = bVar1 & 1;
  if (local_16d != 0) {
    pXVar4 = getDataTypeString(dt_token);
    StrX::StrX((StrX *)local_190,pXVar4);
    pcVar5 = StrX::localForm((StrX *)local_190);
    printf("VALIDATE_TEST Validation Fail:                                                       at line <%d>, data=<%s>, datatype=<%s>, expRetVal=<%d>\n"
           ,0x1545,iv_3,pcVar5,0);
    StrX::~StrX((StrX *)local_190);
    errSeen = true;
  }
  local_194 = st_Init;
  StrX::StrX(&local_1a8,acStack_b8);
  pXVar4 = StrX::unicodeForm(&local_1a8);
  bVar1 = xercesc_4_0::XSValue::validate
                    (pXVar4,dt_token,&local_194,ver_10,
                     xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  StrX::~StrX(&local_1a8);
  local_195 = bVar1 & 1;
  if (local_195 != 0) {
    pXVar4 = getDataTypeString(dt_token);
    StrX::StrX((StrX *)&myStatus_6,pXVar4);
    pcVar5 = StrX::localForm((StrX *)&myStatus_6);
    printf("VALIDATE_TEST Validation Fail:                                                       at line <%d>, data=<%s>, datatype=<%s>, expRetVal=<%d>\n"
           ,0x1546,acStack_b8,pcVar5,0);
    StrX::~StrX((StrX *)&myStatus_6);
    errSeen = true;
  }
  for (actRetValue._4_4_ = 0; actRetValue._4_4_ < 2; actRetValue._4_4_ = actRetValue._4_4_ + 1) {
    bVar11 = actRetValue._4_4_ == 0;
    actRetValue._0_4_ = st_Init;
    StrX::StrX(&local_1d8,v_2 + 4);
    pXVar4 = StrX::unicodeForm(&local_1d8);
    pXVar6 = (XSValue *)
             xercesc_4_0::XSValue::getActualValue
                       (pXVar4,dt_token,(Status *)&actRetValue,ver_10,bVar11,
                        xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    StrX::~StrX(&local_1d8);
    local_1c8 = pXVar6;
    if (pXVar6 == (XSValue *)0x0) {
      if ((Status)actRetValue != st_NoActVal) {
        pXVar4 = getDataTypeString(dt_token);
        StrX::StrX((StrX *)local_1f8,pXVar4);
        pcVar5 = StrX::localForm((StrX *)local_1f8);
        pcVar7 = getStatusString(st_NoActVal);
        pcVar8 = getStatusString((Status)actRetValue);
        printf("ACTVALUE_TEST Context Diff,                                                            at line <%d> data=<%s>, datatype=<%s>,                                                 expStatus=<%s>, actStatus=<%s>\n"
               ,0x1560,v_2 + 4,pcVar5,pcVar7,pcVar8);
        StrX::~StrX((StrX *)local_1f8);
        errSeen = true;
      }
    }
    else {
      pXVar4 = getDataTypeString(dt_token);
      StrX::StrX(&local_1e8,pXVar4);
      StrX::localForm(&local_1e8);
      pvVar10 = (void *)0x1560;
      printf("ACTVALUE_TEST XSValue returned,                                                        at line <%d> data=<%s>, datatype=<%s>\n"
             ,0x1560,v_2 + 4);
      StrX::~StrX(&local_1e8);
      pXVar6 = local_1c8;
      errSeen = true;
      if (local_1c8 != (XSValue *)0x0) {
        xercesc_4_0::XSValue::~XSValue(local_1c8);
        xercesc_4_0::XMemory::operator_delete((XMemory *)pXVar6,pvVar10);
      }
    }
    actRetValue_1._4_4_ = st_Init;
    StrX::StrX(&local_218,v_3 + 8);
    pXVar4 = StrX::unicodeForm(&local_218);
    pXVar6 = (XSValue *)
             xercesc_4_0::XSValue::getActualValue
                       (pXVar4,dt_token,(Status *)((long)&actRetValue_1 + 4),ver_10,bVar11,
                        xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    StrX::~StrX(&local_218);
    local_208 = pXVar6;
    if (pXVar6 == (XSValue *)0x0) {
      if (actRetValue_1._4_4_ != st_NoActVal) {
        pXVar4 = getDataTypeString(dt_token);
        StrX::StrX((StrX *)local_238,pXVar4);
        pcVar5 = StrX::localForm((StrX *)local_238);
        pcVar7 = getStatusString(st_NoActVal);
        pcVar8 = getStatusString(actRetValue_1._4_4_);
        printf("ACTVALUE_TEST Context Diff,                                                            at line <%d> data=<%s>, datatype=<%s>,                                                 expStatus=<%s>, actStatus=<%s>\n"
               ,0x1561,v_3 + 8,pcVar5,pcVar7,pcVar8);
        StrX::~StrX((StrX *)local_238);
        errSeen = true;
      }
    }
    else {
      pXVar4 = getDataTypeString(dt_token);
      StrX::StrX(&local_228,pXVar4);
      StrX::localForm(&local_228);
      pvVar10 = (void *)0x1561;
      printf("ACTVALUE_TEST XSValue returned,                                                        at line <%d> data=<%s>, datatype=<%s>\n"
             ,0x1561,v_3 + 8);
      StrX::~StrX(&local_228);
      pXVar6 = local_208;
      errSeen = true;
      if (local_208 != (XSValue *)0x0) {
        xercesc_4_0::XSValue::~XSValue(local_208);
        xercesc_4_0::XMemory::operator_delete((XMemory *)pXVar6,pvVar10);
      }
    }
    actRetValue_2._4_4_ = st_Init;
    StrX::StrX(&local_258,(char *)((long)&act_v_ran_v_1.fValue + 0x18));
    pXVar4 = StrX::unicodeForm(&local_258);
    pXVar6 = (XSValue *)
             xercesc_4_0::XSValue::getActualValue
                       (pXVar4,dt_token,(Status *)((long)&actRetValue_2 + 4),ver_10,bVar11,
                        xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    StrX::~StrX(&local_258);
    local_248 = pXVar6;
    if (pXVar6 == (XSValue *)0x0) {
      if (actRetValue_2._4_4_ != st_NoActVal) {
        pXVar4 = getDataTypeString(dt_token);
        StrX::StrX((StrX *)local_278,pXVar4);
        pcVar5 = StrX::localForm((StrX *)local_278);
        pcVar7 = getStatusString(st_NoActVal);
        pcVar8 = getStatusString(actRetValue_2._4_4_);
        printf("ACTVALUE_TEST Context Diff,                                                            at line <%d> data=<%s>, datatype=<%s>,                                                 expStatus=<%s>, actStatus=<%s>\n"
               ,0x1562,(undefined1 *)((long)&act_v_ran_v_1.fValue + 0x18),pcVar5,pcVar7,pcVar8);
        StrX::~StrX((StrX *)local_278);
        errSeen = true;
      }
    }
    else {
      pXVar4 = getDataTypeString(dt_token);
      StrX::StrX(&local_268,pXVar4);
      StrX::localForm(&local_268);
      pvVar10 = (void *)0x1562;
      printf("ACTVALUE_TEST XSValue returned,                                                        at line <%d> data=<%s>, datatype=<%s>\n"
             ,0x1562,(undefined1 *)((long)&act_v_ran_v_1.fValue + 0x18));
      StrX::~StrX(&local_268);
      pXVar6 = local_248;
      errSeen = true;
      if (local_248 != (XSValue *)0x0) {
        xercesc_4_0::XSValue::~XSValue(local_248);
        xercesc_4_0::XMemory::operator_delete((XMemory *)pXVar6,pvVar10);
      }
    }
    actRetValue_3._4_4_ = st_Init;
    StrX::StrX(&local_298,iv_3 + 4);
    pXVar4 = StrX::unicodeForm(&local_298);
    pXVar6 = (XSValue *)
             xercesc_4_0::XSValue::getActualValue
                       (pXVar4,dt_token,(Status *)((long)&actRetValue_3 + 4),ver_10,bVar11,
                        xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    StrX::~StrX(&local_298);
    local_288 = pXVar6;
    if (pXVar6 == (XSValue *)0x0) {
      iVar2 = 3;
      if (bVar11) {
        iVar2 = 6;
      }
      if (iVar2 != 10) {
        SVar3 = st_NoActVal;
        if (bVar11) {
          SVar3 = st_FOCA0002;
        }
        if (SVar3 != actRetValue_3._4_4_) {
          pXVar4 = getDataTypeString(dt_token);
          StrX::StrX((StrX *)local_2b8,pXVar4);
          pcVar5 = StrX::localForm((StrX *)local_2b8);
          pcVar7 = getStatusString((uint)bVar11 * 3 + st_NoActVal);
          pcVar8 = getStatusString(actRetValue_3._4_4_);
          printf("ACTVALUE_TEST Context Diff,                                                            at line <%d> data=<%s>, datatype=<%s>,                                                 expStatus=<%s>, actStatus=<%s>\n"
                 ,0x1566,iv_3 + 4,pcVar5,pcVar7,pcVar8);
          StrX::~StrX((StrX *)local_2b8);
          errSeen = true;
        }
      }
    }
    else {
      pXVar4 = getDataTypeString(dt_token);
      StrX::StrX(&local_2a8,pXVar4);
      StrX::localForm(&local_2a8);
      pvVar10 = (void *)0x1566;
      printf("ACTVALUE_TEST XSValue returned,                                                        at line <%d> data=<%s>, datatype=<%s>\n"
             ,0x1566,iv_3 + 4);
      StrX::~StrX(&local_2a8);
      pXVar6 = local_288;
      errSeen = true;
      if (local_288 != (XSValue *)0x0) {
        xercesc_4_0::XSValue::~XSValue(local_288);
        xercesc_4_0::XMemory::operator_delete((XMemory *)pXVar6,pvVar10);
      }
    }
    actRetValue_4._4_4_ = st_Init;
    StrX::StrX(&local_2d8,iv_3);
    pXVar4 = StrX::unicodeForm(&local_2d8);
    pXVar6 = (XSValue *)
             xercesc_4_0::XSValue::getActualValue
                       (pXVar4,dt_token,(Status *)((long)&actRetValue_4 + 4),ver_10,bVar11,
                        xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    StrX::~StrX(&local_2d8);
    local_2c8 = pXVar6;
    if (pXVar6 == (XSValue *)0x0) {
      iVar2 = 3;
      if (bVar11) {
        iVar2 = 6;
      }
      if (iVar2 != 10) {
        SVar3 = st_NoActVal;
        if (bVar11) {
          SVar3 = st_FOCA0002;
        }
        if (SVar3 != actRetValue_4._4_4_) {
          pXVar4 = getDataTypeString(dt_token);
          StrX::StrX((StrX *)local_2f8,pXVar4);
          pcVar5 = StrX::localForm((StrX *)local_2f8);
          pcVar7 = getStatusString((uint)bVar11 * 3 + st_NoActVal);
          pcVar8 = getStatusString(actRetValue_4._4_4_);
          printf("ACTVALUE_TEST Context Diff,                                                            at line <%d> data=<%s>, datatype=<%s>,                                                 expStatus=<%s>, actStatus=<%s>\n"
                 ,0x1568,iv_3,pcVar5,pcVar7,pcVar8);
          StrX::~StrX((StrX *)local_2f8);
          errSeen = true;
        }
      }
    }
    else {
      pXVar4 = getDataTypeString(dt_token);
      StrX::StrX(&local_2e8,pXVar4);
      StrX::localForm(&local_2e8);
      pvVar10 = (void *)0x1568;
      printf("ACTVALUE_TEST XSValue returned,                                                        at line <%d> data=<%s>, datatype=<%s>\n"
             ,0x1568,iv_3);
      StrX::~StrX(&local_2e8);
      pXVar6 = local_2c8;
      errSeen = true;
      if (local_2c8 != (XSValue *)0x0) {
        xercesc_4_0::XSValue::~XSValue(local_2c8);
        xercesc_4_0::XMemory::operator_delete((XMemory *)pXVar6,pvVar10);
      }
    }
    actRetValue_5._4_4_ = st_Init;
    StrX::StrX(&local_318,acStack_b8);
    pXVar4 = StrX::unicodeForm(&local_318);
    pXVar6 = (XSValue *)
             xercesc_4_0::XSValue::getActualValue
                       (pXVar4,dt_token,(Status *)((long)&actRetValue_5 + 4),ver_10,bVar11,
                        xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    StrX::~StrX(&local_318);
    local_308 = pXVar6;
    if (pXVar6 == (XSValue *)0x0) {
      iVar2 = 3;
      if (bVar11) {
        iVar2 = 6;
      }
      if (iVar2 != 10) {
        SVar3 = st_NoActVal;
        if (bVar11) {
          SVar3 = st_FOCA0002;
        }
        if (SVar3 != actRetValue_5._4_4_) {
          pXVar4 = getDataTypeString(dt_token);
          StrX::StrX((StrX *)&myStatus_12,pXVar4);
          pcVar5 = StrX::localForm((StrX *)&myStatus_12);
          pcVar7 = getStatusString((uint)bVar11 * 3 + st_NoActVal);
          pcVar8 = getStatusString(actRetValue_5._4_4_);
          printf("ACTVALUE_TEST Context Diff,                                                            at line <%d> data=<%s>, datatype=<%s>,                                                 expStatus=<%s>, actStatus=<%s>\n"
                 ,0x156a,acStack_b8,pcVar5,pcVar7,pcVar8);
          StrX::~StrX((StrX *)&myStatus_12);
          errSeen = true;
        }
      }
    }
    else {
      pXVar4 = getDataTypeString(dt_token);
      StrX::StrX(&local_328,pXVar4);
      StrX::localForm(&local_328);
      pvVar10 = (void *)0x156a;
      printf("ACTVALUE_TEST XSValue returned,                                                        at line <%d> data=<%s>, datatype=<%s>\n"
             ,0x156a,acStack_b8);
      StrX::~StrX(&local_328);
      pXVar6 = local_308;
      errSeen = true;
      if (local_308 != (XSValue *)0x0) {
        xercesc_4_0::XSValue::~XSValue(local_308);
        xercesc_4_0::XMemory::operator_delete((XMemory *)pXVar6,pvVar10);
      }
    }
  }
  for (actRetCanRep._4_4_ = 0; actRetCanRep._4_4_ < 2; actRetCanRep._4_4_ = actRetCanRep._4_4_ + 1)
  {
    bVar11 = actRetCanRep._4_4_ == 0;
    actRetCanRep._0_4_ = st_Init;
    StrX::StrX(&local_358,v_2 + 4);
    pXVar4 = StrX::unicodeForm(&local_358);
    lVar9 = xercesc_4_0::XSValue::getCanonicalRepresentation
                      (pXVar4,dt_token,(Status *)&actRetCanRep,ver_10,bVar11,
                       xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    StrX::~StrX(&local_358);
    local_348 = lVar9;
    if (lVar9 == 0) {
      if ((Status)actRetCanRep != st_NoCanRep) {
        pXVar4 = getDataTypeString(dt_token);
        StrX::StrX((StrX *)local_378,pXVar4);
        pcVar5 = StrX::localForm((StrX *)local_378);
        pcVar7 = getStatusString(st_NoCanRep);
        pcVar8 = getStatusString((Status)actRetCanRep);
        printf("CANREP_TEST Context Diff,                                                             at line <%d> data=<%s>, datatype=<%s>\n                                               expStatus=<%s>, actStatus=<%s>\n"
               ,0x1587,v_2 + 4,pcVar5,pcVar7,pcVar8);
        StrX::~StrX((StrX *)local_378);
        errSeen = true;
      }
    }
    else {
      pXVar4 = getDataTypeString(dt_token);
      StrX::StrX(&local_368,pXVar4);
      StrX::localForm(&local_368);
      printf("CANREP_TEST CanRep returned:                                                          at line <%d> data=<%s>, datatype=<%s>\n"
             ,0x1587,v_2 + 4);
      StrX::~StrX(&local_368);
      (**(code **)(*(long *)xercesc_4_0::XMLPlatformUtils::fgMemoryManager + 0x20))
                (xercesc_4_0::XMLPlatformUtils::fgMemoryManager,local_348);
      errSeen = true;
    }
    actRetCanRep_1._4_4_ = st_Init;
    StrX::StrX(&local_398,v_3 + 8);
    pXVar4 = StrX::unicodeForm(&local_398);
    lVar9 = xercesc_4_0::XSValue::getCanonicalRepresentation
                      (pXVar4,dt_token,(Status *)((long)&actRetCanRep_1 + 4),ver_10,bVar11,
                       xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    StrX::~StrX(&local_398);
    local_388 = lVar9;
    if (lVar9 == 0) {
      if (actRetCanRep_1._4_4_ != st_NoCanRep) {
        pXVar4 = getDataTypeString(dt_token);
        StrX::StrX((StrX *)local_3b8,pXVar4);
        pcVar5 = StrX::localForm((StrX *)local_3b8);
        pcVar7 = getStatusString(st_NoCanRep);
        pcVar8 = getStatusString(actRetCanRep_1._4_4_);
        printf("CANREP_TEST Context Diff,                                                             at line <%d> data=<%s>, datatype=<%s>\n                                               expStatus=<%s>, actStatus=<%s>\n"
               ,0x1588,v_3 + 8,pcVar5,pcVar7,pcVar8);
        StrX::~StrX((StrX *)local_3b8);
        errSeen = true;
      }
    }
    else {
      pXVar4 = getDataTypeString(dt_token);
      StrX::StrX(&local_3a8,pXVar4);
      StrX::localForm(&local_3a8);
      printf("CANREP_TEST CanRep returned:                                                          at line <%d> data=<%s>, datatype=<%s>\n"
             ,0x1588,v_3 + 8);
      StrX::~StrX(&local_3a8);
      (**(code **)(*(long *)xercesc_4_0::XMLPlatformUtils::fgMemoryManager + 0x20))
                (xercesc_4_0::XMLPlatformUtils::fgMemoryManager,local_388);
      errSeen = true;
    }
    actRetCanRep_2._4_4_ = st_Init;
    StrX::StrX(&local_3d8,(char *)((long)&act_v_ran_v_1.fValue + 0x18));
    pXVar4 = StrX::unicodeForm(&local_3d8);
    lVar9 = xercesc_4_0::XSValue::getCanonicalRepresentation
                      (pXVar4,dt_token,(Status *)((long)&actRetCanRep_2 + 4),ver_10,bVar11,
                       xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    StrX::~StrX(&local_3d8);
    local_3c8 = lVar9;
    if (lVar9 == 0) {
      if (actRetCanRep_2._4_4_ != st_NoCanRep) {
        pXVar4 = getDataTypeString(dt_token);
        StrX::StrX((StrX *)local_3f8,pXVar4);
        pcVar5 = StrX::localForm((StrX *)local_3f8);
        pcVar7 = getStatusString(st_NoCanRep);
        pcVar8 = getStatusString(actRetCanRep_2._4_4_);
        printf("CANREP_TEST Context Diff,                                                             at line <%d> data=<%s>, datatype=<%s>\n                                               expStatus=<%s>, actStatus=<%s>\n"
               ,0x1589,(undefined1 *)((long)&act_v_ran_v_1.fValue + 0x18),pcVar5,pcVar7,pcVar8);
        StrX::~StrX((StrX *)local_3f8);
        errSeen = true;
      }
    }
    else {
      pXVar4 = getDataTypeString(dt_token);
      StrX::StrX(&local_3e8,pXVar4);
      StrX::localForm(&local_3e8);
      printf("CANREP_TEST CanRep returned:                                                          at line <%d> data=<%s>, datatype=<%s>\n"
             ,0x1589,(undefined1 *)((long)&act_v_ran_v_1.fValue + 0x18));
      StrX::~StrX(&local_3e8);
      (**(code **)(*(long *)xercesc_4_0::XMLPlatformUtils::fgMemoryManager + 0x20))
                (xercesc_4_0::XMLPlatformUtils::fgMemoryManager,local_3c8);
      errSeen = true;
    }
    actRetCanRep_3._4_4_ = st_Init;
    StrX::StrX(&local_418,iv_3 + 4);
    pXVar4 = StrX::unicodeForm(&local_418);
    lVar9 = xercesc_4_0::XSValue::getCanonicalRepresentation
                      (pXVar4,dt_token,(Status *)((long)&actRetCanRep_3 + 4),ver_10,bVar11,
                       xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    StrX::~StrX(&local_418);
    local_408 = lVar9;
    if (lVar9 == 0) {
      SVar3 = st_NoCanRep;
      if (bVar11) {
        SVar3 = st_FOCA0002;
      }
      if (SVar3 != actRetCanRep_3._4_4_) {
        pXVar4 = getDataTypeString(dt_token);
        StrX::StrX((StrX *)local_438,pXVar4);
        pcVar5 = StrX::localForm((StrX *)local_438);
        pcVar7 = getStatusString((uint)bVar11 * 4 + st_NoCanRep);
        pcVar8 = getStatusString(actRetCanRep_3._4_4_);
        printf("CANREP_TEST Context Diff,                                                             at line <%d> data=<%s>, datatype=<%s>\n                                               expStatus=<%s>, actStatus=<%s>\n"
               ,0x158d,iv_3 + 4,pcVar5,pcVar7,pcVar8);
        StrX::~StrX((StrX *)local_438);
        errSeen = true;
      }
    }
    else {
      pXVar4 = getDataTypeString(dt_token);
      StrX::StrX(&local_428,pXVar4);
      StrX::localForm(&local_428);
      printf("CANREP_TEST CanRep returned:                                                          at line <%d> data=<%s>, datatype=<%s>\n"
             ,0x158d,iv_3 + 4);
      StrX::~StrX(&local_428);
      (**(code **)(*(long *)xercesc_4_0::XMLPlatformUtils::fgMemoryManager + 0x20))
                (xercesc_4_0::XMLPlatformUtils::fgMemoryManager,local_408);
      errSeen = true;
    }
    actRetCanRep_4._4_4_ = st_Init;
    StrX::StrX(&local_458,iv_3);
    pXVar4 = StrX::unicodeForm(&local_458);
    lVar9 = xercesc_4_0::XSValue::getCanonicalRepresentation
                      (pXVar4,dt_token,(Status *)((long)&actRetCanRep_4 + 4),ver_10,bVar11,
                       xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    StrX::~StrX(&local_458);
    local_448 = lVar9;
    if (lVar9 == 0) {
      SVar3 = st_NoCanRep;
      if (bVar11) {
        SVar3 = st_FOCA0002;
      }
      if (SVar3 != actRetCanRep_4._4_4_) {
        pXVar4 = getDataTypeString(dt_token);
        StrX::StrX((StrX *)local_478,pXVar4);
        pcVar5 = StrX::localForm((StrX *)local_478);
        pcVar7 = getStatusString((uint)bVar11 * 4 + st_NoCanRep);
        pcVar8 = getStatusString(actRetCanRep_4._4_4_);
        printf("CANREP_TEST Context Diff,                                                             at line <%d> data=<%s>, datatype=<%s>\n                                               expStatus=<%s>, actStatus=<%s>\n"
               ,0x158f,iv_3,pcVar5,pcVar7,pcVar8);
        StrX::~StrX((StrX *)local_478);
        errSeen = true;
      }
    }
    else {
      pXVar4 = getDataTypeString(dt_token);
      StrX::StrX(&local_468,pXVar4);
      StrX::localForm(&local_468);
      printf("CANREP_TEST CanRep returned:                                                          at line <%d> data=<%s>, datatype=<%s>\n"
             ,0x158f,iv_3);
      StrX::~StrX(&local_468);
      (**(code **)(*(long *)xercesc_4_0::XMLPlatformUtils::fgMemoryManager + 0x20))
                (xercesc_4_0::XMLPlatformUtils::fgMemoryManager,local_448);
      errSeen = true;
    }
    actRetCanRep_5._4_4_ = st_Init;
    StrX::StrX(&local_498,acStack_b8);
    pXVar4 = StrX::unicodeForm(&local_498);
    lVar9 = xercesc_4_0::XSValue::getCanonicalRepresentation
                      (pXVar4,dt_token,(Status *)((long)&actRetCanRep_5 + 4),ver_10,bVar11,
                       xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    StrX::~StrX(&local_498);
    local_488 = lVar9;
    if (lVar9 == 0) {
      SVar3 = st_NoCanRep;
      if (bVar11) {
        SVar3 = st_FOCA0002;
      }
      if (SVar3 != actRetCanRep_5._4_4_) {
        pXVar4 = getDataTypeString(dt_token);
        StrX::StrX(&local_4b8,pXVar4);
        pcVar5 = StrX::localForm(&local_4b8);
        pcVar7 = getStatusString((uint)bVar11 * 4 + st_NoCanRep);
        pcVar8 = getStatusString(actRetCanRep_5._4_4_);
        printf("CANREP_TEST Context Diff,                                                             at line <%d> data=<%s>, datatype=<%s>\n                                               expStatus=<%s>, actStatus=<%s>\n"
               ,0x1591,acStack_b8,pcVar5,pcVar7,pcVar8);
        StrX::~StrX(&local_4b8);
        errSeen = true;
      }
    }
    else {
      pXVar4 = getDataTypeString(dt_token);
      StrX::StrX(&local_4a8,pXVar4);
      StrX::localForm(&local_4a8);
      printf("CANREP_TEST CanRep returned:                                                          at line <%d> data=<%s>, datatype=<%s>\n"
             ,0x1591,acStack_b8);
      StrX::~StrX(&local_4a8);
      (**(code **)(*(long *)xercesc_4_0::XMLPlatformUtils::fgMemoryManager + 0x20))
                (xercesc_4_0::XMLPlatformUtils::fgMemoryManager,local_488);
      errSeen = true;
    }
  }
  return;
}

Assistant:

void test_dt_token()
{
    const XSValue::DataType dt = XSValue::dt_token;
    bool  toValidate = true;

    const char v_1[]="4+4=8";
    const char v_2[]="Number2";
    const char v_3[]="someChars=*_-";

    XSValue::XSValue_Data act_v_ran_v_1;  act_v_ran_v_1.fValue.f_strVal = 0;
    XSValue::XSValue_Data act_v_ran_v_2;  act_v_ran_v_2.fValue.f_strVal = 0;
    XSValue::XSValue_Data act_v_ran_v_3;  act_v_ran_v_3.fValue.f_strVal = 0;

    const char iv_1[]="a\tb";
    const char iv_2[]="a\nb";
    const char iv_3[]="a  b";

    /***
     *
     * validate
     * ---------
     *                             availability        return value      context
     *                             ----------------------------------------------
     *     valid                                       true              n/a
     *     invalid                      n/a            false             st_FOCA0002
     *
     ***/

    //  valid
    VALIDATE_TEST(v_1,   dt, EXP_RET_VALID_TRUE,  DONT_CARE);
    VALIDATE_TEST(v_2,   dt, EXP_RET_VALID_TRUE,  DONT_CARE);
    VALIDATE_TEST(v_3,   dt, EXP_RET_VALID_TRUE,  DONT_CARE);

    //  invalid
    VALIDATE_TEST(iv_1,  dt, EXP_RET_VALID_FALSE,  DONT_CARE);
    VALIDATE_TEST(iv_2,  dt, EXP_RET_VALID_FALSE,  DONT_CARE);
    VALIDATE_TEST(iv_3,  dt, EXP_RET_VALID_FALSE,  DONT_CARE);

    /***
     *
     * getActualValue
     * ---------------
     *                             availability        return value      context
     *                             ----------------------------------------------
     *  validation on
     *  =============
     *   valid                                             0             st_NoActVal
     *   invalid                                           0             st_FOCA0002
     *
     *  validation off
     *  ==============
     *   valid                                             0             st_NoActVal
     *   invalid                                           0             st_NoActVal
     *
     ***/

    for (int i = 0; i < 2; i++)
    {
        //validation on/off
        toValidate = ( 0 == i) ? true : false;

        //  valid
        ACTVALUE_TEST(v_1,  dt, toValidate, EXP_RET_VALUE_FALSE, XSValue::st_NoActVal, act_v_ran_v_1);
        ACTVALUE_TEST(v_2,  dt, toValidate, EXP_RET_VALUE_FALSE, XSValue::st_NoActVal, act_v_ran_v_1);
        ACTVALUE_TEST(v_3,  dt, toValidate, EXP_RET_VALUE_FALSE, XSValue::st_NoActVal, act_v_ran_v_1);

        //  invalid
        ACTVALUE_TEST(iv_1,  dt, toValidate, EXP_RET_VALUE_FALSE,
            (toValidate ? XSValue::st_FOCA0002 : XSValue::st_NoActVal), act_v_ran_v_1);
        ACTVALUE_TEST(iv_2,  dt, toValidate, EXP_RET_VALUE_FALSE,
            (toValidate ? XSValue::st_FOCA0002 : XSValue::st_NoActVal), act_v_ran_v_1);
        ACTVALUE_TEST(iv_3,  dt, toValidate, EXP_RET_VALUE_FALSE,
            (toValidate ? XSValue::st_FOCA0002 : XSValue::st_NoActVal), act_v_ran_v_1);

    }

    /***
     *
     * getCanonicalRepresentation
     * ---------------------------
     *                             availability        return value      context
     *                             ----------------------------------------------
     *
     *  validation on
     *  =============
     *   valid                                            0              st_NoCanRep
     *   invalid                                          0              st_FOCA0002
     *
     *  validation off
     *  ==============
     *   valid                                            0              st_NoCanRep
     *   invalid                                          0              st_NoCanRep
     *
     ***/

    for (int j = 0; j < 2; j++)
    {
        //validation on/off
        toValidate = ( 0 == j) ? true : false;

        //  valid
        CANREP_TEST(v_1,  dt, toValidate, EXP_RET_CANREP_FALSE, null_string, XSValue::st_NoCanRep);
        CANREP_TEST(v_2,  dt, toValidate, EXP_RET_CANREP_FALSE, null_string, XSValue::st_NoCanRep);
        CANREP_TEST(v_3,  dt, toValidate, EXP_RET_CANREP_FALSE, null_string, XSValue::st_NoCanRep);

        //  invalid
        CANREP_TEST(iv_1,  dt, toValidate, EXP_RET_CANREP_FALSE, null_string,
            (toValidate ? XSValue::st_FOCA0002 : XSValue::st_NoCanRep));
        CANREP_TEST(iv_2,  dt, toValidate, EXP_RET_CANREP_FALSE, null_string,
            (toValidate ? XSValue::st_FOCA0002 : XSValue::st_NoCanRep));
        CANREP_TEST(iv_3,  dt, toValidate, EXP_RET_CANREP_FALSE, null_string,
            (toValidate ? XSValue::st_FOCA0002 : XSValue::st_NoCanRep));

    }

}